

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

void __thiscall higan::HttpResponse::EncodeToBuffer(HttpResponse *this,Buffer *buffer)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  element_type *this_00;
  size_t sVar4;
  StatusCode in_EDX;
  allocator<char> local_129;
  string local_128;
  reference local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *kv;
  iterator __end1;
  iterator __begin1;
  HeaderMap *__range1;
  size_t body_size;
  string local_d8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  int local_5c;
  char local_58 [4];
  int len;
  char line_buff [64];
  Buffer *buffer_local;
  HttpResponse *this_local;
  
  if (buffer != (Buffer *)0x0) {
    line_buff._56_8_ = buffer;
    StatusCodeToString_abi_cxx11_(&local_80,(HttpResponse *)(ulong)this->status_code_,in_EDX);
    uVar3 = std::__cxx11::string::c_str();
    iVar2 = snprintf(local_58,0x40,"HTTP/1.1 %s\r\n",uVar3);
    std::__cxx11::string::~string((string *)&local_80);
    local_5c = iVar2;
    Buffer::Append((Buffer *)line_buff._56_8_,local_58,(long)iVar2);
    uVar3 = line_buff._56_8_;
    if ((this->close_connection_ & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"Connection: Keep-Alive\r\n",
                 (allocator<char> *)((long)&body_size + 7));
      Buffer::Append((Buffer *)uVar3,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&body_size + 7));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Connection: close\r\n",&local_a1);
      Buffer::Append((Buffer *)uVar3,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
    __range1 = (HeaderMap *)Buffer::ReadableSize(&this->body_buffer_);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->file_ptr_);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->file_ptr_);
      sVar4 = FileForRead::GetFileSize(this_00);
      __range1 = (HeaderMap *)(&(__range1->_M_t)._M_impl.field_0x0 + sVar4);
    }
    local_5c = snprintf(local_58,0x40,"Content-Length: %zd\r\n",__range1);
    Buffer::Append((Buffer *)line_buff._56_8_,local_58,(long)local_5c);
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&this->header_map_);
    kv = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(&this->header_map_);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&kv), bVar1) {
      local_108 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*(&__end1);
      Buffer::Append((Buffer *)line_buff._56_8_,&local_108->first);
      uVar3 = line_buff._56_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,": ",&local_129);
      Buffer::Append((Buffer *)uVar3,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      Buffer::Append((Buffer *)line_buff._56_8_,&local_108->second);
      Buffer::AppendCRLF((Buffer *)line_buff._56_8_);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1);
    }
    Buffer::AppendCRLF((Buffer *)line_buff._56_8_);
    Buffer::Append((Buffer *)line_buff._56_8_,&this->body_buffer_);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->file_ptr_);
    if (bVar1) {
      Buffer::Append((Buffer *)line_buff._56_8_,&this->body_buffer_);
    }
  }
  return;
}

Assistant:

void HttpResponse::EncodeToBuffer(Buffer* buffer)
{
	if (!buffer)
	{
		return;
	}

	char line_buff[64];
	int len = snprintf(line_buff, sizeof line_buff, "HTTP/1.1 %s\r\n", StatusCodeToString(status_code_).c_str());
	buffer->Append(line_buff, len);

	if (close_connection_)
	{
		buffer->Append("Connection: close\r\n");
	}
	else
	{
		buffer->Append("Connection: Keep-Alive\r\n");
	}

	size_t body_size = body_buffer_.ReadableSize();
	if (file_ptr_)
	{
		body_size += file_ptr_->GetFileSize();
	}

	len = snprintf(line_buff, sizeof line_buff, "Content-Length: %zd\r\n", body_size);
	buffer->Append(line_buff, len);


	for (const auto& kv : header_map_)
	{
		buffer->Append(kv.first);
		buffer->Append(": ");
		buffer->Append(kv.second);
		buffer->AppendCRLF();
	}

	buffer->AppendCRLF();

	buffer->Append(&body_buffer_);
	if (file_ptr_)
	{
		buffer->Append(&body_buffer_);
	}
}